

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall
higan::TcpConnection::TcpConnection
          (TcpConnection *this,EventLoop *loop,string *connection_name,int fd,InetAddress *address)

{
  Channel *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
  super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
  super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->loop_ = loop;
  (this->connection_name_)._M_dataplus._M_p = (pointer)&(this->connection_name_).field_2;
  pcVar2 = (connection_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->connection_name_,pcVar2,pcVar2 + connection_name->_M_string_length);
  Socket::Socket(&this->socket_,fd,address);
  this_00 = &this->channel_;
  Channel::Channel(this_00,this->loop_,connection_name,fd);
  Buffer::Buffer(&this->input_buffer_);
  Buffer::Buffer(&this->output_buffer_);
  this->connecting_ = false;
  this->call_send_over_callback_ = false;
  p_Var1 = &(this->context_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->message_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->message_callback_).super__Function_base._M_functor + 8) = 0;
  (this->message_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->message_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->error_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->error_callback_).super__Function_base._M_functor + 8) = 0;
  (this->error_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->error_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->new_connection_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->new_connection_callback_).super__Function_base._M_functor + 8) = 0;
  (this->new_connection_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->new_connection_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->write_over_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->write_over_callback_).super__Function_base._M_functor + 8) = 0;
  (this->write_over_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->write_over_callback_)._M_invoker = (_Invoker_type)0x0;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->context_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = OnReadable;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(TcpConnection **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(higan::TcpConnection_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(higan::TcpConnection_*))()>_>
             ::_M_manager;
  Channel::SetReadableCallback(this_00,(ChannelCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = OnWritable;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(TcpConnection **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(higan::TcpConnection_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(higan::TcpConnection_*))()>_>
             ::_M_manager;
  Channel::SetWritableCallback(this_00,(ChannelCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = OnError;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(TcpConnection **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(higan::TcpConnection_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(higan::TcpConnection_*))()>_>
             ::_M_manager;
  Channel::SetErrorCallback(this_00,(ChannelCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

TcpConnection::TcpConnection(EventLoop* loop, const std::string& connection_name, int fd, const InetAddress& address):
		loop_(loop),
		connection_name_(connection_name),
		socket_(fd, address),
		channel_(loop_, connection_name, fd),
		connecting_(false),
		call_send_over_callback_(false)
{
	channel_.SetReadableCallback(std::bind(&TcpConnection::OnReadable, this));
	channel_.SetWritableCallback(std::bind(&TcpConnection::OnWritable, this));
	channel_.SetErrorCallback(std::bind(&TcpConnection::OnError, this));

}